

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  cmd_ln_t *pcVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  int32 *cb2mllr;
  uint n_cb;
  ulong uVar6;
  char line [128];
  char local_b8 [136];
  
  parse_cmd_ln(argc,argv);
  pcVar2 = cmd_ln_get();
  pcVar3 = cmd_ln_str_r(pcVar2,"-nmap");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "Specify # of state -> MLLR class mappings using -nmap\n";
    lVar5 = 0x47;
  }
  else {
    pcVar2 = cmd_ln_get();
    uVar4 = cmd_ln_int_r(pcVar2,"-nmap");
    pcVar2 = cmd_ln_get();
    pcVar3 = cmd_ln_str_r(pcVar2,"-nclass");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "Specify # of MLLR class mappings using -nclass\n";
      lVar5 = 0x4d;
    }
    else {
      pcVar2 = cmd_ln_get();
      lVar5 = cmd_ln_int_r(pcVar2,"-nclass");
      pcVar2 = cmd_ln_get();
      pcVar3 = cmd_ln_str_r(pcVar2,"-cb2mllrfn");
      if (pcVar3 != (char *)0x0) {
        n_cb = (uint)uVar4;
        cb2mllr = (int32 *)__ckd_calloc__((long)(int)n_cb,4,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mllr_class/main.c"
                                          ,0x53);
        if (0 < (int)n_cb) {
          uVar6 = 0;
          do {
            pcVar3 = fgets(local_b8,0x80,_stdin);
            if (pcVar3 == (char *)0x0) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mllr_class/main.c"
                      ,0x58,"Ran out of mappings at %d, but expected %d\n",uVar6 & 0xffffffff,
                      uVar4 & 0xffffffff);
              goto LAB_001028e3;
            }
            iVar1 = atoi(local_b8);
            cb2mllr[uVar6] = iVar1;
            uVar6 = uVar6 + 1;
          } while ((n_cb & 0x7fffffff) != uVar6);
        }
        pcVar3 = fgets(local_b8,0x80,_stdin);
        if (pcVar3 != (char *)0x0) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mllr_class/main.c"
                  ,0x5d,"Expected EOF after %d mappings, but still more data\n",uVar4 & 0xffffffff);
        }
        pcVar2 = cmd_ln_get();
        pcVar3 = cmd_ln_str_r(pcVar2,"-cb2mllrfn");
        iVar1 = s3cb2mllr_write(pcVar3,cb2mllr,n_cb,(uint32)lVar5);
        return (int)(iVar1 != 0);
      }
      pcVar3 = "Specify output file using -cb2mllrfn\n";
      lVar5 = 0x50;
    }
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mllr_class/main.c"
          ,lVar5,pcVar3);
LAB_001028e3:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    int32 i;
    int32 n_map=0;
    int32 n_class=0;
    int32 *mllr_map;
    char line[128];

    parse_cmd_ln(argc, argv);

    if (cmd_ln_str("-nmap")) {
	n_map = cmd_ln_int32("-nmap");
    }
    else {
	E_FATAL("Specify # of state -> MLLR class mappings using -nmap\n");
    }
    if (cmd_ln_str("-nclass")) {
	n_class = cmd_ln_int32("-nclass");
    }
    else {
	E_FATAL("Specify # of MLLR class mappings using -nclass\n");
    }
    if (cmd_ln_str("-cb2mllrfn") == NULL) {
	E_FATAL("Specify output file using -cb2mllrfn\n");
    }

    mllr_map = (int32 *)ckd_calloc(n_map, sizeof(int32));

    for (i = 0; i < n_map; i++) {
	if (fgets(line, 128, stdin) == NULL) {
	    E_FATAL("Ran out of mappings at %d, but expected %d\n",
		    i, n_map);
	}
	mllr_map[i] = atoi(line);
    }
    if (fgets(line, 128, stdin) != NULL) {
	E_WARN("Expected EOF after %d mappings, but still more data\n", n_map);
    }
    
    if (s3cb2mllr_write(cmd_ln_str("-cb2mllrfn"),
			mllr_map,
			n_map,
			n_class) != S3_SUCCESS) {
	return 1;
    }

    return 0;
}